

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O0

char * rapidjson::internal::dtoa(double value,char *buffer,int maxDecimalPlaces)

{
  bool bVar1;
  int local_38;
  int local_34;
  int K;
  int length;
  Double d;
  char *pcStack_20;
  int maxDecimalPlaces_local;
  char *buffer_local;
  double value_local;
  
  d.field_0.u_._4_4_ = maxDecimalPlaces;
  if (maxDecimalPlaces < 1) {
    __assert_fail("maxDecimalPlaces >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/internal/dtoa.h"
                  ,0xd9,"char *rapidjson::internal::dtoa(double, char *, int)");
  }
  Double::Double((Double *)&K,value);
  bVar1 = Double::IsZero((Double *)&K);
  pcStack_20 = buffer;
  if (bVar1) {
    bVar1 = Double::Sign((Double *)&K);
    if (bVar1) {
      pcStack_20 = buffer + 1;
      *buffer = '-';
    }
    *pcStack_20 = '0';
    pcStack_20[1] = '.';
    pcStack_20[2] = '0';
    value_local = (double)(pcStack_20 + 3);
  }
  else {
    buffer_local = (char *)value;
    if (value < 0.0) {
      pcStack_20 = buffer + 1;
      *buffer = '-';
      buffer_local = (char *)((ulong)value ^ 0x8000000000000000);
    }
    Grisu2((double)buffer_local,pcStack_20,&local_34,&local_38);
    value_local = (double)Prettify(pcStack_20,local_34,local_38,d.field_0.u_._4_4_);
  }
  return (char *)value_local;
}

Assistant:

inline char* dtoa(double value, char* buffer, int maxDecimalPlaces = 324) {
    RAPIDJSON_ASSERT(maxDecimalPlaces >= 1);
    Double d(value);
    if (d.IsZero()) {
        if (d.Sign())
            *buffer++ = '-';     // -0.0, Issue #289
        buffer[0] = '0';
        buffer[1] = '.';
        buffer[2] = '0';
        return &buffer[3];
    }
    else {
        if (value < 0) {
            *buffer++ = '-';
            value = -value;
        }
        int length, K;
        Grisu2(value, buffer, &length, &K);
        return Prettify(buffer, length, K, maxDecimalPlaces);
    }
}